

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeblock.cpp
# Opt level: O1

CodeBlock * __thiscall cppgenerate::CodeBlock::operator=(CodeBlock *this,CodeBlock *other)

{
  char *local_40;
  long local_38;
  char local_30 [16];
  
  if (this != other) {
    this->m_indent = other->m_indent;
    local_40 = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"");
    std::__cxx11::stringbuf::str((string *)&this->field_0x8);
    if (local_40 != local_30) {
      operator_delete(local_40);
    }
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,local_40,local_38);
    if (local_40 != local_30) {
      operator_delete(local_40);
    }
  }
  return this;
}

Assistant:

CodeBlock& CodeBlock::operator=( const CodeBlock& other ){
    if( this != &other ){
        m_indent = other.m_indent;
        m_text.str( "" );
        m_text << other.m_text.str();
    }

    return *this;
}